

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUTF16CollationIterator::nextSegment
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  bool bVar1;
  UChar *pUVar2;
  UBool UVar3;
  byte bVar4;
  uint16_t uVar5;
  uint8_t leadCC;
  uint16_t fcd16;
  UChar *q;
  UChar *pUStack_28;
  uint8_t prevCC;
  UChar *p;
  UErrorCode *errorCode_local;
  FCDUTF16CollationIterator *this_local;
  
  p = (UChar *)errorCode;
  errorCode_local = (UErrorCode *)this;
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 != '\0') {
    return '\0';
  }
  pUStack_28 = (this->super_UTF16CollationIterator).pos;
  q._7_1_ = 0;
  do {
    pUVar2 = pUStack_28;
    uVar5 = Normalizer2Impl::nextFCD16(this->nfcImpl,&stack0xffffffffffffffd8,this->rawLimit);
    bVar4 = (byte)(uVar5 >> 8);
    if ((bVar4 == 0) && (pUVar2 != (this->super_UTF16CollationIterator).pos)) {
      this->segmentLimit = pUVar2;
      (this->super_UTF16CollationIterator).limit = pUVar2;
      goto LAB_00276e87;
    }
    if ((bVar4 != 0) &&
       ((bVar4 < q._7_1_ ||
        (UVar3 = CollationFCD::isFCD16OfTibetanCompositeVowel(uVar5), UVar3 != '\0'))))
    goto LAB_00276dc5;
    q._7_1_ = (byte)uVar5;
  } while ((pUStack_28 != this->rawLimit) && (q._7_1_ != 0));
  this->segmentLimit = pUStack_28;
  (this->super_UTF16CollationIterator).limit = pUStack_28;
LAB_00276e87:
  this->checkDir = '\0';
  return '\x01';
LAB_00276dc5:
  do {
    pUVar2 = pUStack_28;
    bVar1 = false;
    if (pUStack_28 != this->rawLimit) {
      uVar5 = Normalizer2Impl::nextFCD16(this->nfcImpl,&stack0xffffffffffffffd8,this->rawLimit);
      bVar1 = 0xff < uVar5;
    }
  } while (bVar1);
  UVar3 = normalize(this,(this->super_UTF16CollationIterator).pos,pUVar2,(UErrorCode *)p);
  if (UVar3 == '\0') {
    return '\0';
  }
  (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).start;
  goto LAB_00276e87;
}

Assistant:

UBool
FCDUTF16CollationIterator::nextSegment(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(checkDir > 0 && pos != limit);
    // The input text [segmentStart..pos[ passes the FCD check.
    const UChar *p = pos;
    uint8_t prevCC = 0;
    for(;;) {
        // Fetch the next character's fcd16 value.
        const UChar *q = p;
        uint16_t fcd16 = nfcImpl.nextFCD16(p, rawLimit);
        uint8_t leadCC = (uint8_t)(fcd16 >> 8);
        if(leadCC == 0 && q != pos) {
            // FCD boundary before the [q, p[ character.
            limit = segmentLimit = q;
            break;
        }
        if(leadCC != 0 && (prevCC > leadCC || CollationFCD::isFCD16OfTibetanCompositeVowel(fcd16))) {
            // Fails FCD check. Find the next FCD boundary and normalize.
            do {
                q = p;
            } while(p != rawLimit && nfcImpl.nextFCD16(p, rawLimit) > 0xff);
            if(!normalize(pos, q, errorCode)) { return FALSE; }
            pos = start;
            break;
        }
        prevCC = (uint8_t)fcd16;
        if(p == rawLimit || prevCC == 0) {
            // FCD boundary after the last character.
            limit = segmentLimit = p;
            break;
        }
    }
    U_ASSERT(pos != limit);
    checkDir = 0;
    return TRUE;
}